

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O2

int Cmd_CommandAbcLoadPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FILE *pFVar5;
  Vec_Str_t *p;
  size_t sVar6;
  char *pcVar7;
  char *format;
  char *pcVar8;
  char *pTempFile;
  Vec_Str_t *local_428;
  undefined8 local_420;
  char pBuffer [1000];
  
  pTempFile = (char *)0x0;
  bVar3 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"vph"), iVar4 == 0x70) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar4 == -1) break;
    if (iVar4 != 0x76) goto LAB_006cc1a4;
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if (globalUtilOptind + 2 == argc) {
    pcVar7 = argv[(long)argc + -2];
    local_420 = argv[(long)argc + -1];
    if (bVar2) {
LAB_006cc112:
      pcVar8 = ".txt";
      iVar4 = Util_SignalTmpFile("__abctmp_",".txt",&pTempFile);
      if (iVar4 == -1) {
        iVar4 = -1;
        Abc_Print(-1,"Cannot create a temporary file.\n");
        p = (Vec_Str_t *)0x0;
        goto LAB_006cc343;
      }
      close(iVar4);
      p = Vec_StrAlloc(1000);
      Vec_StrPrintF(p,pcVar8,pcVar7,pTempFile);
      Vec_StrPush(p,'\0');
      pcVar8 = p->pArray;
      if (bVar3) {
        Abc_Print(2,"Running command %s\n",pcVar8);
      }
      iVar4 = Util_SignalSystem(pcVar8);
      if (iVar4 == 0) {
        local_428 = p;
        pFVar5 = fopen(pTempFile,"r");
        if (pFVar5 == (FILE *)0x0) {
          iVar4 = -1;
          Abc_Print(-1,"Cannot open file with the list of commands.\n");
          p = local_428;
        }
        else {
          while (pcVar8 = fgets(pBuffer,1000,pFVar5), pcVar8 != (char *)0x0) {
            sVar6 = strlen(pBuffer);
            if (pBuffer[sVar6 - 1] == '\n') {
              pBuffer[sVar6 - 1] = '\0';
            }
            Cmd_CommandAdd(pAbc,local_420,pBuffer,Cmd_CommandAbcPlugIn,1);
            pVVar1 = pAbc->vPlugInComBinPairs;
            pcVar8 = Extra_UtilStrsav(pBuffer);
            Vec_PtrPush(pVVar1,pcVar8);
            pVVar1 = pAbc->vPlugInComBinPairs;
            pcVar8 = Extra_UtilStrsav(pcVar7);
            Vec_PtrPush(pVVar1,pcVar8);
            if (bVar3) {
              Abc_Print(2,"Creating command %s with binary %s\n",pBuffer,pcVar7);
            }
          }
          fclose(pFVar5);
          iVar4 = 0;
          p = local_428;
        }
LAB_006cc343:
        if (pTempFile != (char *)0x0) {
          Util_SignalTmpFileRemove(pTempFile,0);
        }
        if (p != (Vec_Str_t *)0x0) {
          free(p->pArray);
          free(p);
        }
        free(pTempFile);
        return iVar4;
      }
      format = "Command \"%s\" failed.\n";
      pcVar7 = pcVar8;
    }
    else {
      pFVar5 = fopen(pcVar7,"r");
      if (pFVar5 != (FILE *)0x0) {
        fclose(pFVar5);
        goto LAB_006cc112;
      }
      format = "Cannot run the binary \"%s\". File does not exist.\n";
      p = (Vec_Str_t *)0x0;
      iVar4 = -1;
    }
    Abc_Print(-1,format,pcVar7);
    goto LAB_006cc343;
  }
LAB_006cc1a4:
  Abc_Print(-2,"usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n");
  Abc_Print(-2,"\t        loads external binary as a plugin\n");
  pcVar8 = "yes";
  pcVar7 = "yes";
  if (!bVar2) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-p    : toggle searching the command in PATH [default = %s].\n",pcVar7);
  if (!bVar3) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar8);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Cmd_CommandAbcLoadPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int fPath, fVerbose;
    int fd = -1, RetValue = -1, c;
    FILE * pFile = NULL;
    char * pStrDirBin = NULL, * pStrSection = NULL;
    Vec_Str_t * sCommandLine = NULL;
    char * pTempFile = NULL;
    char pBuffer[1000];

    // set defaults
    fPath = 0;
    fVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'p':
            fPath ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
        goto usage;
    }
    }

    if ( argc != globalUtilOptind + 2 )
        goto usage;

    pStrDirBin  = argv[argc-2];
    pStrSection = argv[argc-1];

    // check if the file exists
    if ( !fPath )
    {
        FILE* pFile = fopen( pStrDirBin, "r" );

        if ( !pFile )
        {
            Abc_Print( ABC_ERROR, "Cannot run the binary \"%s\". File does not exist.\n", pStrDirBin );
            goto cleanup;
    }

    fclose( pFile );
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".txt", &pTempFile );

    if ( fd == -1 )
    {
        Abc_Print( ABC_ERROR, "Cannot create a temporary file.\n" );
        goto cleanup;
    }

#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // get command list
    sCommandLine = Vec_StrAlloc(1000);

    Vec_StrPrintF(sCommandLine, "%s -abc -list-commands > %s", pStrDirBin, pTempFile );
    Vec_StrPush(sCommandLine, '\0');

    if(fVerbose)
    {
        Abc_Print(ABC_VERBOSE, "Running command %s\n", Vec_StrArray(sCommandLine));
    }

    RetValue = Util_SignalSystem( Vec_StrArray(sCommandLine) );

    if ( RetValue != 0 )
    {
        Abc_Print( ABC_ERROR, "Command \"%s\" failed.\n", Vec_StrArray(sCommandLine) );
        goto cleanup;
    }

    // create commands
    pFile = fopen( pTempFile, "r" );

    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open file with the list of commands.\n" );

        RetValue = -1;
        goto cleanup;
    }

    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        if ( pBuffer[strlen(pBuffer)-1] == '\n' )
            pBuffer[strlen(pBuffer)-1] = 0;

        Cmd_CommandAdd( pAbc, pStrSection, pBuffer, Cmd_CommandAbcPlugIn, 1 );

        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pBuffer) );
        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pStrDirBin) );

        if ( fVerbose )
        {
            Abc_Print(ABC_VERBOSE, "Creating command %s with binary %s\n", pBuffer, pStrDirBin);
    }
    }

cleanup:

    if( pFile )
    fclose( pFile );

    if( pTempFile )
    Util_SignalTmpFileRemove( pTempFile, 0 );

    Vec_StrFreeP(&sCommandLine);

    ABC_FREE( pTempFile );

    return RetValue;

usage:

    Abc_Print( -2, "usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n" );
    Abc_Print( -2, "\t        loads external binary as a plugin\n" );
    Abc_Print( -2, "\t-p    : toggle searching the command in PATH [default = %s].\n", fPath? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");

    return 1;
}